

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O2

int bssl::dtls1_flush(SSL *ssl)

{
  byte bVar1;
  DTLSSentRecord t;
  CBB *out;
  undefined8 max_out;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  int iVar7;
  pointer __p;
  size_t sVar8;
  ulong uVar9;
  DTLSRecordNumber *pDVar10;
  uint8_t *puVar11;
  uchar *puVar12;
  DTLS1_STATE *pDVar13;
  DTLSOutgoingMessage *pDVar14;
  size_t sVar15;
  size_t len;
  DTLSOutgoingMessage *pDVar16;
  MRUQueue<bssl::DTLSSentRecord,_32UL> *pMVar17;
  byte bVar18;
  ushort uVar19;
  size_t in_R9;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  Range RVar24;
  Span<const_unsigned_char> SVar25;
  Span<unsigned_char> SVar26;
  OPENSSL_timeval now;
  size_t local_680;
  long local_678;
  uint32_t local_66c;
  Array<unsigned_char> local_668;
  size_t local_650;
  size_t record_len;
  size_t local_640;
  Span<unsigned_char> local_638;
  CBS cbs;
  CBB cbb;
  Span<const_unsigned_char> body;
  CBS body_cbs;
  CBB child;
  InplaceVector<bssl::DTLSRecordNumber,_32UL> sorted;
  uint8_t record [584];
  uint8_t buf [514];
  
  pDVar13 = ssl->d1;
  uVar19 = *(ushort *)pDVar13;
  if ((uVar19 & 0x40) != 0) {
    uVar5 = ssl_protocol_version(ssl);
    if (uVar5 < 0x304) {
      __assert_fail("ssl_protocol_version(ssl) >= TLS1_3_VERSION",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0x3c2,"int bssl::send_ack(SSL *)");
    }
    dtls1_update_mtu(ssl);
    sVar8 = dtls_seal_max_input_len
                      (ssl,*(uint16_t *)((long)&(ssl->d1->write_epoch).next_record.combined_ + 6),
                       (ulong)ssl->d1->mtu);
    if (sVar8 < 0x12) {
      iVar7 = 0xa9;
      iVar6 = 0x3ca;
      goto LAB_00166499;
    }
    iVar7 = -1;
    uVar9 = sVar8 - 2 >> 4;
    pDVar13 = ssl->d1;
    uVar21 = (ulong)(pDVar13->records_to_ack).storage_.size_;
    sorted.size_ = '\0';
    uVar22 = 0;
    if (uVar9 <= uVar21) {
      uVar22 = uVar21 - uVar9;
    }
    for (; uVar22 < uVar21; uVar22 = uVar22 + 1) {
      pDVar10 = MRUQueue<bssl::DTLSRecordNumber,_32UL>::operator[](&pDVar13->records_to_ack,uVar22);
      InplaceVector<bssl::DTLSRecordNumber,_32UL>::PushBack
                (&sorted,(DTLSRecordNumber)pDVar10->combined_);
      pDVar13 = ssl->d1;
      uVar21 = (ulong)(pDVar13->records_to_ack).storage_.size_;
    }
    std::__sort<bssl::DTLSRecordNumber*,__gnu_cxx::__ops::_Iter_less_iter>
              (&sorted,sorted.storage_ + (ulong)sorted.size_ * 8);
    CBB_init_fixed(&cbb,buf,0x202);
    iVar6 = CBB_add_u16_length_prefixed(&cbb,&child);
    if (iVar6 == 0) {
      abort();
    }
    uVar22 = (ulong)sorted.size_;
    lVar23 = 0;
    while (uVar22 * 8 != lVar23) {
      iVar6 = CBB_add_u64(&child,(ulong)*(ushort *)(sorted.storage_ + lVar23 + 6));
      if (iVar6 == 0) {
        abort();
      }
      iVar6 = CBB_add_u64(&child,*(ulong *)(sorted.storage_ + lVar23) & 0xffffffffffff);
      lVar23 = lVar23 + 8;
      if (iVar6 == 0) {
        abort();
      }
    }
    iVar6 = CBB_flush(&cbb);
    if (iVar6 == 0) {
      abort();
    }
    cbs.data = (uint8_t *)0x0;
    puVar11 = CBB_data(&cbb);
    sVar8 = CBB_len(&cbb);
    in_R9 = 0x1a;
    bVar2 = dtls_seal_record(ssl,(DTLSRecordNumber *)&cbs,record,&record_len,0x248,'\x1a',puVar11,
                             sVar8,*(uint16_t *)
                                    ((long)&(ssl->d1->write_epoch).next_record.combined_ + 6));
    if (bVar2) {
      puVar11 = CBB_data(&cbb);
      puVar12 = (uchar *)CBB_len(&cbb);
      iVar7 = 1;
      SVar25.size_ = in_R9;
      SVar25.data_ = puVar12;
      ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x1a,(int)puVar11,SVar25);
      iVar6 = BIO_write((BIO *)(ssl->wbio)._M_t.
                               super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,record,
                        (int)record_len);
      if (0 < iVar6) {
        iVar6 = BIO_flush((ssl->wbio)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
        if (0 < iVar6) goto LAB_00166445;
        iVar6 = -1;
      }
      iVar7 = iVar6;
      ssl->s3->rwstate = 3;
    }
LAB_00166445:
    InplaceVector<bssl::DTLSRecordNumber,_32UL>::~InplaceVector(&sorted);
    if (iVar7 < 1) {
      return iVar7;
    }
    *(ushort *)ssl->d1 = *(ushort *)ssl->d1 & 0xffbf;
    pDVar13 = ssl->d1;
    uVar19 = *(ushort *)pDVar13;
  }
  if ((uVar19 & 0x20) == 0) {
    return 1;
  }
  if (ssl->s3->write_shutdown == ssl_shutdown_none) {
    if ((ssl->wbio)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_st_*,_false>._M_head_impl == (bio_st *)0x0) {
      iVar7 = 0x77;
      iVar6 = 0x36e;
    }
    else {
      if (pDVar13->num_timeouts < 0xd) {
        dtls1_update_mtu(ssl);
        local_668.data_ = (uchar *)0x0;
        local_668.size_ = 0;
        bVar2 = Array<unsigned_char>::InitUninitialized(&local_668,(ulong)ssl->d1->mtu);
        iVar7 = -1;
        if (bVar2) {
LAB_00166526:
          iVar7 = -1;
          pDVar13 = ssl->d1;
          bVar1 = pDVar13->outgoing_written;
          if (bVar1 < (pDVar13->outgoing_messages).size_) {
            local_66c = pDVar13->outgoing_offset;
            local_638.size_ = local_668.size_;
            local_638.data_ = local_668.data_;
            local_678 = 0;
            bVar3 = bVar1;
            do {
              sVar8 = local_638.size_;
              puVar11 = local_638.data_;
              local_680 = 0;
              child._0_16_ = local_638;
              while (bVar18 = (pDVar13->outgoing_messages).size_, bVar3 < bVar18) {
                pDVar14 = InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::operator[]
                                    (&pDVar13->outgoing_messages,(ulong)bVar3);
                pDVar13 = ssl->d1;
                if ((pDVar14->is_ccs != false) || ((pDVar14->acked).bytes_.size_ != 0)) {
                  bVar18 = (pDVar13->outgoing_messages).size_;
                  bVar3 = pDVar13->outgoing_written;
                  break;
                }
                pDVar13->outgoing_offset = 0;
                bVar3 = pDVar13->outgoing_written + 1;
                pDVar13->outgoing_written = bVar3;
              }
              if (bVar3 < bVar18) {
                pDVar14 = InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::operator[]
                                    (&pDVar13->outgoing_messages,(ulong)bVar3);
                sVar15 = dtls_seal_prefix_len(ssl,pDVar14->epoch);
                len = dtls_seal_max_input_len(ssl,pDVar14->epoch,sVar8);
                if (len == 0) goto LAB_001666ad;
                if (pDVar14->is_ccs == true) {
                  record[0] = '\0';
                  record[1] = '\0';
                  record[2] = '\0';
                  record[3] = '\0';
                  record[4] = '\0';
                  record[5] = '\0';
                  record[6] = '\0';
                  record[7] = '\0';
                  in_R9 = 0x14;
                  bVar2 = dtls_seal_record(ssl,(DTLSRecordNumber *)record,puVar11,&local_680,sVar8,
                                           '\x14',
                                           "\x01/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                                           ,1,pDVar14->epoch);
                  iVar7 = 0;
                  if (bVar2) {
                    in.size_ = in_R9;
                    in.data_ = (uchar *)0x1;
                    ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x14,0x21c5e4,in);
                    pDVar13 = ssl->d1;
                    pDVar13->outgoing_offset = 0;
                    puVar11 = &pDVar13->outgoing_written;
                    *puVar11 = *puVar11 + '\x01';
                    iVar7 = 1;
                  }
                }
                else {
                  uVar5 = pDVar14->epoch;
                  _record_len = Span<unsigned_char>::subspan
                                          ((Span<unsigned_char> *)&child,sVar15,len);
                  CBB_init_fixed((CBB *)record,record_len,record_len._8_8_);
                  sorted.storage_[0] = '\0';
                  sorted.storage_[1] = '\0';
                  sorted.storage_[2] = '\0';
                  sorted.storage_[3] = '\0';
                  sorted.storage_[4] = '\0';
                  sorted.storage_[5] = '\0';
                  sorted.storage_[6] = '\0';
                  sorted.storage_[7] = '\0';
                  sorted.storage_[9] = '\0';
                  sorted.storage_[0x10] = '\0';
                  sorted.storage_[0x11] = '\0';
                  sorted.storage_[0x12] = '\0';
                  sorted.storage_[0x13] = '\0';
                  sorted.storage_[8] = ssl->d1->outgoing_written;
                  sorted.storage_._12_4_ = ssl->d1->outgoing_offset;
                  do {
                    pDVar13 = ssl->d1;
                    if ((pDVar13->outgoing_messages).size_ <= pDVar13->outgoing_written) {
                      bVar2 = false;
                      goto LAB_00166a25;
                    }
                    pDVar16 = InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::operator[]
                                        (&pDVar13->outgoing_messages,
                                         (ulong)pDVar13->outgoing_written);
                    bVar2 = true;
                    if ((pDVar16->epoch != pDVar14->epoch) || (pDVar16->is_ccs != false))
                    goto LAB_00166a25;
                    cbs.data = (pDVar16->data).data_;
                    cbs.len = (pDVar16->data).size_;
                    bVar2 = dtls1_parse_fragment(&cbs,(hm_header_st *)&cbb,&body_cbs);
                    if ((!bVar2 || cbb._12_4_ != 0) ||
                       (((body_cbs.len != (uint)cbb.u._0_4_ || (cbb.u._0_4_ != cbb.child._4_4_)) ||
                        (cbs.len != 0)))) {
                      ERR_put_error(0x10,0,0x44,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                                    ,0x2ec);
                      goto LAB_00166a1b;
                    }
                    body.data_ = body_cbs.data;
                    uVar20 = ssl->d1->outgoing_offset;
                    body.size_ = (ulong)(uint)cbb.u._0_4_;
                    do {
                      RVar24 = DTLSMessageBitmap::NextUnmarkedRange(&pDVar16->acked,(ulong)uVar20);
                      uVar22 = RVar24.end - RVar24.start;
                      bVar2 = uVar22 == 0;
                      if (bVar2) {
                        pDVar13 = ssl->d1;
                        pDVar13->outgoing_offset = 0;
                        puVar11 = &pDVar13->outgoing_written;
                        *puVar11 = *puVar11 + '\x01';
                        iVar7 = 0;
                        if (uVar5 == 0) goto LAB_00166a25;
                        goto LAB_001669c2;
                      }
                      sVar8 = local_640;
                      sVar15 = CBB_len((CBB *)record);
                      if (sVar8 - sVar15 < 0xd) goto LAB_00166a25;
                      uVar21 = (sVar8 - sVar15) - 0xc;
                      uVar9 = uVar22;
                      if (uVar21 < uVar22) {
                        uVar9 = uVar21;
                      }
                      if (body.size_ == 0) {
                        SVar25 = (Span<const_unsigned_char>)ZEXT816(0);
                      }
                      else {
                        SVar25 = Span<const_unsigned_char>::subspan(&body,RVar24.start,uVar9);
                      }
                      local_650 = SVar25.size_;
                      sVar8 = CBB_len((CBB *)record);
                      iVar7 = CBB_add_u8((CBB *)record,(uint8_t)cbb.child);
                      if (((iVar7 == 0) ||
                          (iVar7 = CBB_add_u24((CBB *)record,cbb.child._4_4_), iVar7 == 0)) ||
                         (iVar7 = CBB_add_u16((CBB *)record,cbb._8_2_), iVar7 == 0)) {
LAB_001669a5:
                        ERR_put_error(0x10,0,0x44,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                                      ,0x313);
                        iVar7 = 1;
                        goto LAB_001669c2;
                      }
                      iVar7 = CBB_add_u24((CBB *)record,(uint32_t)RVar24.start);
                      if (((iVar7 == 0) ||
                          (iVar7 = CBB_add_u24_length_prefixed((CBB *)record,(CBB *)buf), iVar7 == 0
                          )) || ((iVar7 = CBB_add_bytes((CBB *)buf,SVar25.data_,local_650),
                                 iVar7 == 0 || (iVar7 = CBB_flush((CBB *)record), iVar7 == 0))))
                      goto LAB_001669a5;
                      sVar15 = CBB_len((CBB *)record);
                      SVar26 = Span<unsigned_char>::subspan
                                         ((Span<unsigned_char> *)&record_len,sVar8,sVar15 - sVar8);
                      in_00.size_ = in_R9;
                      in_00.data_ = (uchar *)SVar26.size_;
                      ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x16,(int)SVar26.data_,in_00);
                      uVar20 = (int)uVar9 + (uint32_t)RVar24.start;
                      ssl->d1->outgoing_offset = uVar20;
                    } while (uVar22 <= uVar21);
                    iVar7 = 8;
LAB_001669c2:
                  } while (iVar7 == 0);
                  bVar2 = false;
                  if ((iVar7 == 8) || (iVar7 == 5)) {
LAB_00166a25:
                    sorted.storage_[9] = ssl->d1->outgoing_written;
                    sorted.storage_._16_4_ = ssl->d1->outgoing_offset;
                    sVar8 = CBB_len((CBB *)record);
                    if (sVar8 == 0) {
                      iVar7 = 2;
                      if (bVar2 != false) {
                        __assert_fail("!should_continue",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                                      ,0x331,
                                      "seal_result_t bssl::seal_next_record(SSL *, Span<uint8_t>, size_t *)"
                                     );
                      }
                    }
                    else {
                      out = child.child;
                      max_out = child._8_8_;
                      puVar11 = CBB_data((CBB *)record);
                      sVar8 = CBB_len((CBB *)record);
                      in_R9 = 0x16;
                      bVar4 = dtls_seal_record(ssl,(DTLSRecordNumber *)&sorted,(uint8_t *)out,
                                               &local_680,max_out,'\x16',puVar11,sVar8,
                                               pDVar14->epoch);
                      iVar7 = 0;
                      if (bVar4) {
                        if ((ssl->s3->version == 0) ||
                           (uVar5 = ssl_protocol_version(ssl), 0x303 < uVar5)) {
                          pMVar17 = (ssl->d1->sent_records)._M_t.
                                    super___uniq_ptr_impl<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>_*,_bssl::internal::Deleter>
                                    .
                                    super__Head_base<0UL,_bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>_*,_false>
                                    ._M_head_impl;
                          if (pMVar17 == (MRUQueue<bssl::DTLSSentRecord,_32UL> *)0x0) {
                            pMVar17 = New<bssl::MRUQueue<bssl::DTLSSentRecord,32ul>>();
                            buf[0] = '\0';
                            buf[1] = '\0';
                            buf[2] = '\0';
                            buf[3] = '\0';
                            buf[4] = '\0';
                            buf[5] = '\0';
                            buf[6] = '\0';
                            buf[7] = '\0';
                            std::
                            __uniq_ptr_impl<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>
                            ::reset((__uniq_ptr_impl<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>
                                     *)&ssl->d1->sent_records,pMVar17);
                            std::
                            unique_ptr<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>
                            ::~unique_ptr((unique_ptr<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>
                                           *)buf);
                            pMVar17 = (ssl->d1->sent_records)._M_t.
                                      super___uniq_ptr_impl<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>_*,_bssl::internal::Deleter>
                                      .
                                      super__Head_base<0UL,_bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>_*,_false>
                                      ._M_head_impl;
                            if (pMVar17 == (MRUQueue<bssl::DTLSSentRecord,_32UL> *)0x0)
                            goto LAB_00166b80;
                          }
                          t.last_msg = sorted.storage_[9];
                          t.first_msg = sorted.storage_[8];
                          t._10_1_ = sorted.storage_[10];
                          t._11_1_ = sorted.storage_[0xb];
                          t.first_msg_start._0_1_ = sorted.storage_[0xc];
                          t.first_msg_start._1_1_ = sorted.storage_[0xd];
                          t.first_msg_start._2_1_ = sorted.storage_[0xe];
                          t.first_msg_start._3_1_ = sorted.storage_[0xf];
                          t.number.combined_._0_1_ = sorted.storage_[0];
                          t.number.combined_._1_1_ = sorted.storage_[1];
                          t.number.combined_._2_1_ = sorted.storage_[2];
                          t.number.combined_._3_1_ = sorted.storage_[3];
                          t.number.combined_._4_1_ = sorted.storage_[4];
                          t.number.combined_._5_1_ = sorted.storage_[5];
                          t.number.combined_._6_1_ = sorted.storage_[6];
                          t.number.combined_._7_1_ = sorted.storage_[7];
                          t.last_msg_end._0_2_ = sorted.storage_._16_2_;
                          t._18_6_ = (int6)(CONCAT44(sorted.storage_._20_4_,sorted.storage_._16_4_)
                                           >> 0x10);
                          MRUQueue<bssl::DTLSSentRecord,_32UL>::PushBack(pMVar17,t);
                        }
                        iVar7 = 2 - (uint)bVar2;
                      }
                    }
                  }
                  else {
LAB_00166a1b:
                    iVar7 = 0;
                  }
                }
LAB_00166b80:
                if (iVar7 == 0) {
                  iVar7 = -1;
                  goto LAB_00166c3d;
                }
              }
              else {
LAB_001666ad:
                iVar7 = 2;
              }
              local_638 = Span<unsigned_char>::subspan(&local_638,local_680,0xffffffffffffffff);
              local_678 = local_678 + local_680;
              if (iVar7 == 2) goto LAB_00166bd1;
              pDVar13 = ssl->d1;
              bVar3 = pDVar13->outgoing_written;
            } while( true );
          }
          iVar6 = BIO_flush((ssl->wbio)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>.
                            _M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
          if (iVar6 < 1) {
            ssl->s3->rwstate = 3;
          }
          else {
            iVar7 = 1;
          }
        }
LAB_00166c3d:
        Array<unsigned_char>::~Array(&local_668);
        if (0 < iVar7) {
          pDVar13 = ssl->d1;
          pDVar13->outgoing_written = '\0';
          pDVar13->outgoing_offset = 0;
          *(byte *)pDVar13 = *(byte *)pDVar13 & 0xdf;
          iVar7 = SSL_in_init(ssl);
          if ((iVar7 != 0) || (uVar5 = ssl_protocol_version(ssl), 0x303 < uVar5)) {
            pDVar13 = ssl->d1;
            if (pDVar13->num_timeouts == 0) {
              uVar20 = ssl->initial_timeout_duration_ms;
            }
            else {
              uVar20 = pDVar13->timeout_duration_ms * 2;
              if (59999 < uVar20) {
                uVar20 = 60000;
              }
            }
            pDVar13->timeout_duration_ms = uVar20;
            now = ssl_ctx_get_current_time
                            ((ssl->ctx)._M_t.
                             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
            DTLSTimer::StartMicroseconds
                      (&ssl->d1->retransmit_timer,now,(ulong)ssl->d1->timeout_duration_ms * 1000);
          }
          iVar7 = 1;
        }
        return iVar7;
      }
      iVar7 = 0xc6;
      iVar6 = 0x373;
    }
  }
  else {
    iVar7 = 0xc2;
    iVar6 = 0x369;
  }
LAB_00166499:
  ERR_put_error(0x10,0,iVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                ,iVar6);
  return -1;
LAB_00166bd1:
  if (local_678 != 0) {
    iVar7 = BIO_write((BIO *)(ssl->wbio)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>
                             ._M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,local_668.data_,
                      (int)local_678);
    if (iVar7 < 1) {
      pDVar13 = ssl->d1;
      pDVar13->outgoing_written = bVar1;
      pDVar13->outgoing_offset = local_66c;
      ssl->s3->rwstate = 3;
      goto LAB_00166c3d;
    }
    goto LAB_00166526;
  }
  if (ssl->d1->outgoing_written < (ssl->d1->outgoing_messages).size_) goto code_r0x00166c1a;
  goto LAB_00166526;
code_r0x00166c1a:
  iVar7 = 0;
  ERR_put_error(0x10,0,0xa9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                ,0x38b);
  goto LAB_00166c3d;
}

Assistant:

int dtls1_flush(SSL *ssl) {
  // Send the pending ACK, if any.
  if (ssl->d1->sending_ack) {
    int ret = send_ack(ssl);
    if (ret <= 0) {
      return ret;
    }
    ssl->d1->sending_ack = false;
  }

  // Send the pending flight, if any.
  if (ssl->d1->sending_flight) {
    int ret = send_flight(ssl);
    if (ret <= 0) {
      return ret;
    }

    // Reset state for the next send.
    ssl->d1->outgoing_written = 0;
    ssl->d1->outgoing_offset = 0;
    ssl->d1->sending_flight = false;

    // Schedule the next retransmit timer. In DTLS 1.3, we retransmit all
    // flights until ACKed. In DTLS 1.2, the final Finished flight is never
    // ACKed, so we do not keep the timer running after the handshake.
    if (SSL_in_init(ssl) || ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
      if (ssl->d1->num_timeouts == 0) {
        ssl->d1->timeout_duration_ms = ssl->initial_timeout_duration_ms;
      } else {
        ssl->d1->timeout_duration_ms =
            std::min(ssl->d1->timeout_duration_ms * 2, uint32_t{60000});
      }

      OPENSSL_timeval now = ssl_ctx_get_current_time(ssl->ctx.get());
      ssl->d1->retransmit_timer.StartMicroseconds(
          now, uint64_t{ssl->d1->timeout_duration_ms} * 1000);
    }
  }

  return 1;
}